

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O3

void __thiscall
host_array_copy_initialize_Test::~host_array_copy_initialize_Test
          (host_array_copy_initialize_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

CAMP_TEST_BEGIN(array, copy_construct)
{
   camp::array<int, 3> a{1, 2, 10};
   camp::array<int, 3> b{a};
   a[1] = 1;

   return b[0] == 1 &&
          b[1] == 2 &&
          b[2] == 10;
}